

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O1

helix_session_t
helix_session_create(helix_protocol_t proto,helix_event_callback_t callback,void *data)

{
  helix_session_t phVar1;
  helix_session_t local_38;
  helix_event_callback_t p_Stack_30;
  code *local_28;
  code *pcStack_20;
  
  phVar1 = (helix_session_t)(**(code **)(*(long *)proto + 0x10))(proto,data);
  pcStack_20 = std::
               _Function_handler<void_(const_helix::event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:91:32)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_helix::event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:91:32)>
             ::_M_manager;
  local_38 = phVar1;
  p_Stack_30 = callback;
  (**(code **)(*(long *)phVar1 + 0x20))(phVar1);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return phVar1;
}

Assistant:

helix_session_t
helix_session_create(helix_protocol_t proto, helix_event_callback_t callback, void *data)
{
    auto session = unwrap(proto)->new_session(data);
    session->register_callback([session, callback](const helix::event& event) {
        callback(wrap(session), wrap(const_cast<helix::event*>(&event)));
    });
    return wrap(session);
}